

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O0

void __thiscall
pico_tree::internal::
list_pool_resource<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_256UL>::
~list_pool_resource(list_pool_resource<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_256UL>
                    *this)

{
  void *in_RDI;
  
  ~list_pool_resource((list_pool_resource<pico_tree::internal::kd_tree_node_euclidean<int,_double>,_256UL>
                       *)0x101eb8);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

virtual ~list_pool_resource() { release(); }